

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_copy_img2comp(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  int tstatus;
  int bitpix;
  int nmore;
  int nkeys;
  char card [81];
  char card2 [81];
  char *patterns [12] [2];
  
  memcpy(patterns,&DAT_001faa00,0xc0);
  iVar1 = *status;
  if (iVar1 < 1) {
    ffgcrd(infptr,"EXTNAME",card,status);
    if (*status != 0) {
      *status = 0;
      builtin_strncpy(card + 0x10,"ESSED_IMAGE\'",0xd);
      builtin_strncpy(card,"EXTNAME = \'COMPR",0x10);
      ffprec(outfptr,card,status);
    }
    fits_translate_keywords(infptr,outfptr,1,patterns,0xc,0,0,0,status);
    if (outfptr->Fptr->request_lossy_int_compress != 0) {
      ffgky(infptr,0x1f,"BITPIX",&bitpix,(char *)0x0,status);
      if ((*status < 1) && (0 < bitpix)) {
        ffmkyj(outfptr,"ZBITPIX",-0x20,(char *)0x0,status);
        tstatus = 0;
        ffdkey(outfptr,"BSCALE",&tstatus);
        tstatus = 0;
        ffdkey(outfptr,"BZERO",&tstatus);
        tstatus = 0;
        ffdkey(outfptr,"BLANK",&tstatus);
      }
    }
    tstatus = 0;
    iVar1 = ffgcrd(outfptr,"ZQUANTIZ",card,&tstatus);
    if (iVar1 == 0) {
      ffdkey(outfptr,"ZQUANTIZ",status);
      ffprec(outfptr,card,status);
      ffpsvc(card,card2,(char *)0x0,status);
      iVar1 = fits_strncasecmp(card2,"\'NONE",5);
      if (iVar1 != 0) {
        ffphis(outfptr,"Image was compressed by CFITSIO using scaled integer quantization:",status);
        snprintf(card2,0x51,"  q = %f / quantized level scaling parameter",
                 SUB84((double)outfptr->Fptr->request_quantize_level,0));
        ffphis(outfptr,card2,status);
        ffphis(outfptr,card + 10,status);
      }
    }
    tstatus = 0;
    iVar1 = ffgcrd(outfptr,"ZDITHER0",card,&tstatus);
    if (iVar1 == 0) {
      ffdkey(outfptr,"ZDITHER0",status);
      ffprec(outfptr,card,status);
    }
    ffghsp(infptr,&nkeys,&nmore,status);
    uVar2 = (long)nmore / 0x24 & 0xffffffff;
    nmore = (int)((long)nmore / 0x24);
    for (iVar1 = 0; iVar1 < (int)uVar2; iVar1 = iVar1 + 1) {
      iVar3 = 0x24;
      while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
        ffprec(outfptr,"    ",status);
      }
      uVar2 = (ulong)(uint)nmore;
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int imcomp_copy_img2comp(fitsfile *infptr, fitsfile *outfptr, int *status)
/*
    This routine copies the header keywords from the uncompressed input image 
    and to the compressed image (in a binary table) 
*/
{
    char card[FLEN_CARD], card2[FLEN_CARD];	/* a header record */
    int nkeys, nmore, ii, jj, tstatus, bitpix;

    /* tile compressed image keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */
    char *patterns[][2] = {{"SIMPLE",  "ZSIMPLE" },  
			   {"XTENSION", "ZTENSION" },
			   {"BITPIX",  "ZBITPIX" },
			   {"NAXIS",   "ZNAXIS"  },
			   {"NAXISm",  "ZNAXISm" },
			   {"EXTEND",  "ZEXTEND" },
			   {"BLOCKED", "ZBLOCKED"},
			   {"PCOUNT",  "ZPCOUNT" },  
			   {"GCOUNT",  "ZGCOUNT" },

			   {"CHECKSUM","ZHECKSUM"},  /* save original checksums */
			   {"DATASUM", "ZDATASUM"},
			   
			   {"*",       "+"       }}; /* copy all other keywords */
    int npat;

    if (*status > 0)
        return(*status);

    /* write a default EXTNAME keyword if it doesn't exist in input file*/
    fits_read_card(infptr, "EXTNAME", card, status);
    
    if (*status) {
       *status = 0;
       strcpy(card, "EXTNAME = 'COMPRESSED_IMAGE'");
       fits_write_record(outfptr, card, status);
    }

    /* copy all the keywords from the input file to the output */
    npat = sizeof(patterns)/sizeof(patterns[0][0])/2;
    fits_translate_keywords(infptr, outfptr, 1, patterns, npat,
			    0, 0, 0, status);


    if ( (outfptr->Fptr)->request_lossy_int_compress != 0) { 

	/* request was made to compress integer images as if they had float pixels. */
	/* If input image has positive bitpix value, then reset the output ZBITPIX */
	/* value to -32. */

	fits_read_key(infptr, TINT, "BITPIX", &bitpix, NULL, status);

	if (*status <= 0 && bitpix > 0) {
	    fits_modify_key_lng(outfptr, "ZBITPIX", -32, NULL, status);

	    /* also delete the BSCALE, BZERO, and BLANK keywords */
	    tstatus = 0;
	    fits_delete_key(outfptr, "BSCALE", &tstatus);
	    tstatus = 0;
	    fits_delete_key(outfptr, "BZERO", &tstatus);
	    tstatus = 0;
	    fits_delete_key(outfptr, "BLANK", &tstatus);
	}
    }

   /*
     For compatibility with software that uses an older version of CFITSIO,
     we must make certain that the new ZQUANTIZ keyword, if it exists, must
     occur after the other peudo-required keywords (e.g., ZSIMPLE, ZBITPIX,
     etc.).  Do this by trying to delete the keyword.  If that succeeds (and
     thus the keyword did exist) then rewrite the keyword at the end of header.
     In principle this should not be necessary once all software has upgraded
     to a newer version of CFITSIO (version number greater than 3.181, newer
     than August 2009).
     
     Do the same for the new ZDITHER0 keyword.
   */

   tstatus = 0;
   if (fits_read_card(outfptr, "ZQUANTIZ", card, &tstatus) == 0)
   {
        fits_delete_key(outfptr, "ZQUANTIZ", status);

        /* rewrite the deleted keyword at the end of the header */
        fits_write_record(outfptr, card, status);

	/* write some associated HISTORY keywords */
        fits_parse_value(card, card2, NULL, status);
	if (fits_strncasecmp(card2, "'NONE", 5) ) {
	    /* the value is not 'NONE' */	
	    fits_write_history(outfptr, 
	        "Image was compressed by CFITSIO using scaled integer quantization:", status);
	    snprintf(card2, FLEN_CARD,"  q = %f / quantized level scaling parameter", 
	        (outfptr->Fptr)->request_quantize_level);
	    fits_write_history(outfptr, card2, status); 
	    fits_write_history(outfptr, card+10, status); 
	}
   }

   tstatus = 0;
   if (fits_read_card(outfptr, "ZDITHER0", card, &tstatus) == 0)
   {
        fits_delete_key(outfptr, "ZDITHER0", status);

        /* rewrite the deleted keyword at the end of the header */
        fits_write_record(outfptr, card, status);
   }


    ffghsp(infptr, &nkeys, &nmore, status); /* get number of keywords in image */

    nmore = nmore / 36;  /* how many completely empty header blocks are there? */
     
     /* preserve the same number of spare header blocks in the output header */
     
    for (jj = 0; jj < nmore; jj++)
       for (ii = 0; ii < 36; ii++)
          fits_write_record(outfptr, "    ", status);

    return (*status);
}